

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O0

void __thiscall QMenu::showTearOffMenu(QMenu *this,QPoint *pos)

{
  bool bVar1;
  int ah;
  int aw;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QTornOffMenu *unaff_retaddr;
  QSize *s;
  QMenuPrivate *d;
  QTornOffMenu *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  QWidget *in_stack_ffffffffffffffc0;
  QMenu *p;
  
  p = *(QMenu **)(in_FS_OFFSET + 0x28);
  d_func((QMenu *)0x646e0f);
  bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QTornOffMenu> *)0x646e25);
  if (!bVar1) {
    in_stack_ffffffffffffffc0 = (QWidget *)operator_new(0x28);
    QTornOffMenu::QTornOffMenu(unaff_retaddr,p);
    QPointer<QTornOffMenu>::operator=
              ((QPointer<QTornOffMenu> *)
               CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               in_stack_ffffffffffffffa8);
  }
  (**(code **)(*(long *)in_RDI + 0x70))();
  QPointer<QTornOffMenu>::operator->((QPointer<QTornOffMenu> *)0x646e98);
  QPoint::x((QPoint *)0x646ea6);
  ah = QPoint::y((QPoint *)0x646eb4);
  aw = QSize::width((QSize *)0x646ec2);
  QSize::height((QSize *)0x646ed0);
  QWidget::setGeometry
            (in_RDI,(int)((ulong)in_stack_ffffffffffffffc0 >> 0x20),(int)in_stack_ffffffffffffffc0,
             aw,ah);
  QPointer<QTornOffMenu>::operator->((QPointer<QTornOffMenu> *)0x646ef9);
  QWidget::show(in_stack_ffffffffffffffc0);
  if (*(QMenu **)(in_FS_OFFSET + 0x28) == p) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMenu::showTearOffMenu(const QPoint &pos)
{
    Q_D(QMenu);
    if (!d->tornPopup)
        d->tornPopup = new QTornOffMenu(this);
    const QSize &s = sizeHint();
    d->tornPopup->setGeometry(pos.x(), pos.y(), s.width(), s.height());
    d->tornPopup->show();
}